

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
DecodeConnectivity(MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                   *this)

{
  int64_t *piVar1;
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  *this_00;
  MeshEdgebreakerTraversalPredictiveDecoder *this_01;
  DecoderBuffer *pDVar2;
  pointer piVar3;
  pointer pTVar4;
  pointer pHVar5;
  pointer pIVar6;
  pointer pAVar7;
  uint *puVar8;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *puVar9;
  bool bVar10;
  ushort uVar11;
  int32_t iVar12;
  int iVar13;
  int iVar14;
  MeshEdgebreakerDecoder *pMVar15;
  CornerTable *pCVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  CornerIndex ci;
  CornerIndex corner;
  uint *puVar20;
  pointer __p;
  uint8_t num_attribute_data;
  uint32_t num_faces;
  uint32_t num_encoded_split_symbols;
  uint32_t num_encoded_symbols;
  uint32_t encoded_connectivity_size;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *local_78;
  int local_70;
  uint32_t num_encoded_vertices;
  DecoderBuffer traversal_end_buffer;
  
  this->num_new_vertices_ = 0;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->new_to_parent_vertex_map_)._M_h);
  pMVar15 = this->decoder_;
  iVar13._0_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  iVar13._1_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  iVar13._2_2_ = *(undefined2 *)&(pMVar15->super_MeshDecoder).super_PointCloudDecoder.field_0x4a;
  if ((ushort)((ushort)(pMVar15->super_MeshDecoder).super_PointCloudDecoder.version_minor_ |
              (ushort)(iVar13 << 8)) < 0x202) {
    pDVar2 = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    if ((byte)iVar13 < 2) {
      bVar10 = DecoderBuffer::Decode<unsigned_int>(pDVar2,(uint *)&traversal_end_buffer);
    }
    else {
      bVar10 = DecodeVarint<unsigned_int>((uint *)&traversal_end_buffer,pDVar2);
    }
    if (bVar10 == false) {
      return false;
    }
    this->num_new_vertices_ = (int)traversal_end_buffer.data_;
    pMVar15 = this->decoder_;
    iVar13._0_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  }
  pDVar2 = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((byte)iVar13 < 2) {
    bVar10 = DecoderBuffer::Decode<unsigned_int>(pDVar2,&num_encoded_vertices);
  }
  else {
    bVar10 = DecodeVarint<unsigned_int>(&num_encoded_vertices,pDVar2);
  }
  if (bVar10 != false) {
    this->num_encoded_vertices_ = num_encoded_vertices;
    pDVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
      bVar10 = DecoderBuffer::Decode<unsigned_int>(pDVar2,&num_faces);
    }
    else {
      bVar10 = DecodeVarint<unsigned_int>(&num_faces,pDVar2);
    }
    if ((bVar10 != false) && ((ulong)num_faces < 0x55555556)) {
      uVar18 = this->num_encoded_vertices_;
      uVar19 = (ulong)num_faces * 3;
      if ((uVar18 <= (uint)uVar19) &&
         ((uVar19 >> 1 <= (ulong)(((long)(int)uVar18 + -1) * (long)(int)uVar18) >> 1 &&
          (bVar10 = DecoderBuffer::Decode<unsigned_char>
                              ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_,
                               &num_attribute_data), bVar10)))) {
        pDVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
        if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
          bVar10 = DecoderBuffer::Decode<unsigned_int>(pDVar2,&num_encoded_symbols);
        }
        else {
          bVar10 = DecodeVarint<unsigned_int>(&num_encoded_symbols,pDVar2);
        }
        if ((bVar10 != false) && (num_encoded_symbols <= num_faces)) {
          if (num_encoded_symbols / 3 + num_encoded_symbols < num_faces) {
            return false;
          }
          pDVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
          if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
            bVar10 = DecoderBuffer::Decode<unsigned_int>(pDVar2,&num_encoded_split_symbols);
          }
          else {
            bVar10 = DecodeVarint<unsigned_int>(&num_encoded_split_symbols,pDVar2);
          }
          if ((bVar10 != false) && (num_encoded_split_symbols <= num_encoded_symbols)) {
            piVar3 = (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish != piVar3) {
              (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = piVar3;
            }
            pCVar16 = (CornerTable *)operator_new(0xa8);
            CornerTable::CornerTable(pCVar16);
            traversal_end_buffer.data_ = (char *)0x0;
            std::__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            reset((__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                  &this->corner_table_,pCVar16);
            std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            ~unique_ptr((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                        &traversal_end_buffer);
            if ((this->corner_table_)._M_t.
                super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
                _M_t.
                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl !=
                (CornerTable *)0x0) {
              piVar3 = (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish != piVar3) {
                (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar3;
              }
              std::vector<int,_std::allocator<int>_>::reserve
                        (&this->processed_corner_ids_,(ulong)num_faces);
              piVar3 = (this->processed_connectivity_corners_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              if ((this->processed_connectivity_corners_).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish != piVar3) {
                (this->processed_connectivity_corners_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = piVar3;
              }
              std::vector<int,_std::allocator<int>_>::reserve
                        (&this->processed_connectivity_corners_,(ulong)num_faces);
              pTVar4 = (this->topology_split_data_).
                       super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->topology_split_data_).
                  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pTVar4) {
                (this->topology_split_data_).
                super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                ._M_impl.super__Vector_impl_data._M_finish = pTVar4;
              }
              pHVar5 = (this->hole_event_data_).
                       super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->hole_event_data_).
                  super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pHVar5) {
                (this->hole_event_data_).
                super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>.
                _M_impl.super__Vector_impl_data._M_finish = pHVar5;
              }
              pIVar6 = (this->init_corners_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                   (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              if ((this->init_corners_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
                (this->init_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
              }
              this->last_symbol_id_ = -1;
              this->last_vert_id_ = -1;
              this->last_face_id_ = -1;
              this_00 = &this->attribute_data_;
              std::
              vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
              ::clear(this_00);
              std::
              vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
              ::resize(this_00,(ulong)num_attribute_data);
              bVar10 = CornerTable::Reset((this->corner_table_)._M_t.
                                          super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                          .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                          _M_head_impl,num_faces,
                                          num_encoded_split_symbols + this->num_encoded_vertices_);
              if (bVar10) {
                local_78 = &this->corner_table_;
                std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                          (&this->is_vert_hole_,
                           (ulong)(num_encoded_split_symbols + this->num_encoded_vertices_),true);
                pMVar15 = this->decoder_;
                iVar14._0_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.version_major_;
                iVar14._1_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
                iVar14._2_2_ = *(undefined2 *)
                                &(pMVar15->super_MeshDecoder).super_PointCloudDecoder.field_0x4a;
                if ((ushort)((ushort)(pMVar15->super_MeshDecoder).super_PointCloudDecoder.
                                     version_minor_ | (ushort)(iVar14 << 8)) < 0x202) {
                  pDVar2 = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                  if ((byte)(undefined1)iVar14 < 2) {
                    bVar10 = DecoderBuffer::Decode<unsigned_int>(pDVar2,&encoded_connectivity_size);
                  }
                  else {
                    bVar10 = DecodeVarint<unsigned_int>(&encoded_connectivity_size,pDVar2);
                  }
                  if (((bVar10 != false) && ((ulong)encoded_connectivity_size != 0)) &&
                     (pDVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_,
                     (long)(ulong)encoded_connectivity_size <= pDVar2->data_size_ - pDVar2->pos_)) {
                    DecoderBuffer::DecoderBuffer(&traversal_end_buffer);
                    pDVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                    lVar17 = (ulong)encoded_connectivity_size + pDVar2->pos_;
                    DecoderBuffer::Init(&traversal_end_buffer,pDVar2->data_ + lVar17,
                                        pDVar2->data_size_ - lVar17,pDVar2->bitstream_version_);
                    iVar13 = DecodeHoleAndTopologySplitEvents(this,&traversal_end_buffer);
                    DecoderBuffer::BitDecoder::~BitDecoder(&traversal_end_buffer.bit_decoder_);
                    if (iVar13 != -1) goto LAB_0011e76f;
                  }
                }
                else {
                  iVar12 = DecodeHoleAndTopologySplitEvents
                                     (this,(pMVar15->super_MeshDecoder).super_PointCloudDecoder.
                                           buffer_);
                  if (iVar12 != -1) {
                    iVar13 = -1;
LAB_0011e76f:
                    this_01 = &this->traversal_decoder_;
                    MeshEdgebreakerTraversalPredictiveDecoder::Init
                              (this_01,&this->super_MeshEdgebreakerDecoderImplInterface);
                    (this->traversal_decoder_).num_vertices_ =
                         num_encoded_split_symbols + this->num_encoded_vertices_;
                    (this->traversal_decoder_).super_MeshEdgebreakerTraversalDecoder.
                    num_attribute_data_ = (uint)num_attribute_data;
                    DecoderBuffer::DecoderBuffer(&traversal_end_buffer);
                    bVar10 = MeshEdgebreakerTraversalPredictiveDecoder::Start
                                       (this_01,&traversal_end_buffer);
                    if ((bVar10) &&
                       (local_70 = DecodeConnectivity(this,num_encoded_symbols), local_70 != -1)) {
                      pDVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                      DecoderBuffer::Init(pDVar2,traversal_end_buffer.data_ +
                                                 traversal_end_buffer.pos_,
                                          traversal_end_buffer.data_size_ -
                                          traversal_end_buffer.pos_,pDVar2->bitstream_version_);
                      pMVar15 = this->decoder_;
                      uVar11._0_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.
                                     version_major_;
                      uVar11._1_1_ = (pMVar15->super_MeshDecoder).super_PointCloudDecoder.
                                     version_minor_;
                      uVar11 = uVar11 << 8 | uVar11 >> 8;
                      if (uVar11 < 0x202) {
                        piVar1 = &((pMVar15->super_MeshDecoder).super_PointCloudDecoder.buffer_)->
                                  pos_;
                        *piVar1 = *piVar1 + (long)iVar13;
                      }
                      if ((this->attribute_data_).
                          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                          (this->attribute_data_).
                          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011e939:
                        MeshEdgebreakerTraversalDecoder::Done
                                  (&this_01->super_MeshEdgebreakerTraversalDecoder);
                        uVar18 = 0;
                        do {
                          uVar19 = (ulong)uVar18;
                          pAVar7 = (this->attribute_data_).
                                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if ((ulong)(((long)(this->attribute_data_).
                                             super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pAVar7) / 0x140) <= uVar19) {
                            pCVar16 = (this->corner_table_)._M_t.
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                      _M_head_impl;
                            MeshAttributeIndicesEncodingData::Init
                                      (&this->pos_encoding_data_,
                                       (int)((ulong)((long)*(pointer *)
                                                            ((long)&(pCVar16->vertex_corners_).
                                                                    vector_ + 8) -
                                                    *(long *)&(pCVar16->vertex_corners_).vector_.
                                                                                                                            
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ) >> 2));
                            puVar9 = local_78;
                            uVar18 = 0;
                            while( true ) {
                              uVar19 = (ulong)uVar18;
                              pAVar7 = (this->attribute_data_).
                                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              if ((ulong)(((long)(this->attribute_data_).
                                                 super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pAVar7) / 0x140) <= uVar19) break;
                              pCVar16 = (puVar9->_M_t).
                                        super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                        .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                        _M_head_impl;
                              iVar14 = (int)((ulong)((long)*(pointer *)
                                                            ((long)&pAVar7[uVar19].connectivity_data
                                                                    .
                                                  vertex_to_attribute_entry_id_map_.
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                                  + 8) - *(long *)&pAVar7[uVar19].connectivity_data.
                                                                   vertex_to_attribute_entry_id_map_
                                                                   .
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2);
                              iVar13 = (int)((ulong)((long)*(pointer *)
                                                            ((long)&(pCVar16->vertex_corners_).
                                                                    vector_ + 8) -
                                                    *(long *)&(pCVar16->vertex_corners_).vector_.
                                                                                                                            
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ) >> 2);
                              if (iVar13 < iVar14) {
                                iVar13 = iVar14;
                              }
                              MeshAttributeIndicesEncodingData::Init
                                        (&pAVar7[uVar19].encoding_data,iVar13);
                              uVar18 = uVar18 + 1;
                            }
                            bVar10 = AssignPointsToCorners(this,local_70);
                            goto LAB_0011e9db;
                          }
                          MeshAttributeCornerTable::InitEmpty
                                    (&pAVar7[uVar19].connectivity_data,
                                     (local_78->_M_t).
                                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                     .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                     _M_head_impl);
                          pAVar7 = (this_00->
                                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          puVar8 = *(uint **)((long)&pAVar7[uVar19].attribute_seam_corners.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl + 8);
                          for (puVar20 = *(uint **)&pAVar7[uVar19].attribute_seam_corners.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl; puVar20 != puVar8;
                              puVar20 = puVar20 + 1) {
                            MeshAttributeCornerTable::AddSeamEdge
                                      (&(this_00->
                                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar19].
                                        connectivity_data,(CornerIndex)*puVar20);
                          }
                          bVar10 = MeshAttributeCornerTable::RecomputeVertices
                                             (&(this_00->
                                               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar19].
                                               connectivity_data,(Mesh *)0x0,(PointAttribute *)0x0);
                          uVar18 = uVar18 + 1;
                        } while (bVar10);
                      }
                      else {
                        corner.value_ = 0;
                        if (uVar11 < 0x201) {
                          do {
                            pCVar16 = (local_78->_M_t).
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                      _M_head_impl;
                            if ((uint)((ulong)((long)*(pointer *)
                                                      ((long)&(pCVar16->corner_to_vertex_map_).
                                                              vector_ + 8) -
                                              *(long *)&(pCVar16->corner_to_vertex_map_).vector_) >>
                                      2) <= corner.value_) goto LAB_0011e939;
                            bVar10 = DecodeAttributeConnectivitiesOnFaceLegacy(this,corner);
                            corner.value_ = corner.value_ + 3;
                          } while (bVar10);
                        }
                        else {
                          do {
                            pCVar16 = (local_78->_M_t).
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                      _M_head_impl;
                            if ((uint)((ulong)((long)*(pointer *)
                                                      ((long)&(pCVar16->corner_to_vertex_map_).
                                                              vector_ + 8) -
                                              *(long *)&(pCVar16->corner_to_vertex_map_).vector_) >>
                                      2) <= corner.value_) goto LAB_0011e939;
                            bVar10 = DecodeAttributeConnectivitiesOnFace(this,corner);
                            corner.value_ = corner.value_ + 3;
                          } while (bVar10);
                        }
                      }
                    }
                    bVar10 = false;
LAB_0011e9db:
                    DecoderBuffer::BitDecoder::~BitDecoder(&traversal_end_buffer.bit_decoder_);
                    return bVar10;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeConnectivity() {
  num_new_vertices_ = 0;
  new_to_parent_vertex_map_.clear();
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t num_new_verts;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&num_new_verts)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&num_new_verts, decoder_->buffer())) {
        return false;
      }
    }
    num_new_vertices_ = num_new_verts;
  }
#endif

  uint32_t num_encoded_vertices;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_vertices)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_vertices, decoder_->buffer())) {
      return false;
    }
  }
  num_encoded_vertices_ = num_encoded_vertices;

  uint32_t num_faces;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_faces)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, decoder_->buffer())) {
      return false;
    }
  }
  if (num_faces > std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;  // Draco cannot handle this many faces.
  }

  if (static_cast<uint32_t>(num_encoded_vertices_) > num_faces * 3) {
    return false;  // There cannot be more vertices than 3 * num_faces.
  }

  // Minimum number of edges of the mesh assuming each edge is shared between
  // two faces.
  const uint32_t min_num_face_edges = 3 * num_faces / 2;

  // Maximum number of edges that can exist between |num_encoded_vertices_|.
  // This is based on graph theory assuming simple connected graph.
  const uint64_t num_encoded_vertices_64 =
      static_cast<uint64_t>(num_encoded_vertices_);
  const uint64_t max_num_vertex_edges =
      num_encoded_vertices_64 * (num_encoded_vertices_64 - 1) / 2;
  if (max_num_vertex_edges < min_num_face_edges) {
    // It is impossible to construct a manifold mesh with these properties.
    return false;
  }

  uint8_t num_attribute_data;
  if (!decoder_->buffer()->Decode(&num_attribute_data)) {
    return false;
  }

  uint32_t num_encoded_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_faces < num_encoded_symbols) {
    // Number of faces needs to be the same or greater than the number of
    // symbols (it can be greater because the initial face may not be encoded as
    // a symbol).
    return false;
  }
  const uint32_t max_encoded_faces =
      num_encoded_symbols + (num_encoded_symbols / 3);
  if (num_faces > max_encoded_faces) {
    // Faces can only be 1 1/3 times bigger than number of encoded symbols. This
    // could only happen if all new encoded components started with interior
    // triangles. E.g. A mesh with multiple tetrahedrons.
    return false;
  }

  uint32_t num_encoded_split_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_split_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_split_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_encoded_split_symbols > num_encoded_symbols) {
    return false;  // Split symbols are a sub-set of all symbols.
  }

  // Decode topology (connectivity).
  vertex_traversal_length_.clear();
  corner_table_ = std::unique_ptr<CornerTable>(new CornerTable());
  if (corner_table_ == nullptr) {
    return false;
  }
  processed_corner_ids_.clear();
  processed_corner_ids_.reserve(num_faces);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(num_faces);
  topology_split_data_.clear();
  hole_event_data_.clear();
  init_face_configurations_.clear();
  init_corners_.clear();

  last_symbol_id_ = -1;
  last_face_id_ = -1;
  last_vert_id_ = -1;

  attribute_data_.clear();
  // Add one attribute data for each attribute decoder.
  attribute_data_.resize(num_attribute_data);

  if (!corner_table_->Reset(
          num_faces, num_encoded_vertices_ + num_encoded_split_symbols)) {
    return false;
  }

  // Start with all vertices marked as holes (boundaries).
  // Only vertices decoded with TOPOLOGY_C symbol (and the initial face) will
  // be marked as non hole vertices. We need to allocate the array larger
  // because split symbols can create extra vertices during the decoding
  // process (these extra vertices are then eliminated during deduplication).
  is_vert_hole_.assign(num_encoded_vertices_ + num_encoded_split_symbols, true);

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  int32_t topology_split_decoded_bytes = -1;
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t encoded_connectivity_size;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&encoded_connectivity_size)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&encoded_connectivity_size, decoder_->buffer())) {
        return false;
      }
    }
    if (encoded_connectivity_size == 0 ||
        encoded_connectivity_size > decoder_->buffer()->remaining_size()) {
      return false;
    }
    DecoderBuffer event_buffer;
    event_buffer.Init(
        decoder_->buffer()->data_head() + encoded_connectivity_size,
        decoder_->buffer()->remaining_size() - encoded_connectivity_size,
        decoder_->buffer()->bitstream_version());
    // Decode hole and topology split events.
    topology_split_decoded_bytes =
        DecodeHoleAndTopologySplitEvents(&event_buffer);
    if (topology_split_decoded_bytes == -1) {
      return false;
    }

  } else
#endif
  {
    if (DecodeHoleAndTopologySplitEvents(decoder_->buffer()) == -1) {
      return false;
    }
  }

  traversal_decoder_.Init(this);
  // Add one extra vertex for each split symbol.
  traversal_decoder_.SetNumEncodedVertices(num_encoded_vertices_ +
                                           num_encoded_split_symbols);
  traversal_decoder_.SetNumAttributeData(num_attribute_data);

  DecoderBuffer traversal_end_buffer;
  if (!traversal_decoder_.Start(&traversal_end_buffer)) {
    return false;
  }

  const int num_connectivity_verts = DecodeConnectivity(num_encoded_symbols);
  if (num_connectivity_verts == -1) {
    return false;
  }

  // Set the main buffer to the end of the traversal.
  decoder_->buffer()->Init(traversal_end_buffer.data_head(),
                           traversal_end_buffer.remaining_size(),
                           decoder_->buffer()->bitstream_version());

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Skip topology split data that was already decoded earlier.
    decoder_->buffer()->Advance(topology_split_decoded_bytes);
  }
#endif

  // Decode connectivity of non-position attributes.
  if (!attribute_data_.empty()) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFaceLegacy(ci)) {
          return false;
        }
      }

    } else
#endif
    {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFace(ci)) {
          return false;
        }
      }
    }
  }
  traversal_decoder_.Done();

  // Decode attribute connectivity.
  // Prepare data structure for decoding non-position attribute connectivity.
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    attribute_data_[i].connectivity_data.InitEmpty(corner_table_.get());
    // Add all seams.
    for (int32_t c : attribute_data_[i].attribute_seam_corners) {
      attribute_data_[i].connectivity_data.AddSeamEdge(CornerIndex(c));
    }
    // Recompute vertices from the newly added seam edges.
    if (!attribute_data_[i].connectivity_data.RecomputeVertices(nullptr,
                                                                nullptr)) {
      return false;
    }
  }

  pos_encoding_data_.Init(corner_table_->num_vertices());
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    // For non-position attributes, preallocate the vertex to value mapping
    // using the maximum number of vertices from the base corner table and the
    // attribute corner table (since the attribute decoder may use either of
    // it).
    int32_t att_connectivity_verts =
        attribute_data_[i].connectivity_data.num_vertices();
    if (att_connectivity_verts < corner_table_->num_vertices()) {
      att_connectivity_verts = corner_table_->num_vertices();
    }
    attribute_data_[i].encoding_data.Init(att_connectivity_verts);
  }
  if (!AssignPointsToCorners(num_connectivity_verts)) {
    return false;
  }
  return true;
}